

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  test1();
  test2();
  test3();
  test4();
  test5();
  test6();
  return 0;
}

Assistant:

int main()
{
    test1();
    test2();
    test3();
    test4();
    test5();
    test6();
    return 0;
}